

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

ssize_t uv__fs_fdatasync(uv_fs_t *req)

{
  int iVar1;
  uv_fs_t *req_local;
  
  iVar1 = fdatasync(req->file);
  return (long)iVar1;
}

Assistant:

static ssize_t uv__fs_fdatasync(uv_fs_t* req) {
#if defined(__linux__) || defined(__sun) || defined(__NetBSD__)
  return fdatasync(req->file);
#elif defined(__APPLE__)
  /* Apple's fdatasync and fsync explicitly do NOT flush the drive write cache
   * to the drive platters. This is in contrast to Linux's fdatasync and fsync
   * which do, according to recent man pages. F_FULLFSYNC is Apple's equivalent
   * for flushing buffered data to permanent storage.
   */
  return fcntl(req->file, F_FULLFSYNC);
#else
  return fsync(req->file);
#endif
}